

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest_lite.pb.cc
# Opt level: O2

size_t __thiscall proto2_unittest::TestPackedTypesLite::ByteSizeLong(TestPackedTypesLite *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  size_t sVar8;
  size_t sVar9;
  size_t sVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  ulong uVar14;
  size_t sVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long local_a8;
  long local_a0;
  long local_98;
  
  sVar8 = google::protobuf::internal::WireFormatLite::Int32SizeWithPackedTagSize
                    (&(this->field_0)._impl_.packed_int32_,2,
                     &(this->field_0)._impl_._packed_int32_cached_byte_size_);
  sVar9 = google::protobuf::internal::WireFormatLite::Int64SizeWithPackedTagSize
                    (&(this->field_0)._impl_.packed_int64_,2,
                     &(this->field_0)._impl_._packed_int64_cached_byte_size_);
  sVar10 = google::protobuf::internal::WireFormatLite::UInt32SizeWithPackedTagSize
                     (&(this->field_0)._impl_.packed_uint32_,2,
                      &(this->field_0)._impl_._packed_uint32_cached_byte_size_);
  sVar11 = google::protobuf::internal::WireFormatLite::UInt64SizeWithPackedTagSize
                     (&(this->field_0)._impl_.packed_uint64_,2,
                      &(this->field_0)._impl_._packed_uint64_cached_byte_size_);
  sVar12 = google::protobuf::internal::WireFormatLite::SInt32SizeWithPackedTagSize
                     (&(this->field_0)._impl_.packed_sint32_,2,
                      &(this->field_0)._impl_._packed_sint32_cached_byte_size_);
  sVar13 = google::protobuf::internal::WireFormatLite::SInt64SizeWithPackedTagSize
                     (&(this->field_0)._impl_.packed_sint64_,2,
                      &(this->field_0)._impl_._packed_sint64_cached_byte_size_);
  uVar1 = google::protobuf::RepeatedField<unsigned_int>::size
                    (&(this->field_0)._impl_.packed_fixed32_);
  if (uVar1 == 0) {
    local_98 = 0;
  }
  else {
    uVar14 = ((long)((ulong)uVar1 << 0x22) >> 0x20) + 1;
    lVar19 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar19 == 0; lVar19 = lVar19 + -1) {
      }
    }
    local_98 = (ulong)((int)lVar19 * 9 + 0x49U >> 6) + 2;
  }
  uVar2 = google::protobuf::RepeatedField<unsigned_long>::size
                    (&(this->field_0)._impl_.packed_fixed64_);
  if (uVar2 == 0) {
    lVar19 = 0;
  }
  else {
    uVar14 = ((long)((ulong)uVar2 << 0x23) >> 0x20) + 1;
    lVar19 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar19 == 0; lVar19 = lVar19 + -1) {
      }
    }
    lVar19 = (ulong)((int)lVar19 * 9 + 0x49U >> 6) + 2;
  }
  uVar3 = google::protobuf::RepeatedField<int>::size(&(this->field_0)._impl_.packed_sfixed32_);
  if (uVar3 == 0) {
    local_a0 = 0;
  }
  else {
    uVar14 = ((long)((ulong)uVar3 << 0x22) >> 0x20) + 1;
    lVar17 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    local_a0 = (ulong)((int)lVar17 * 9 + 0x49U >> 6) + 2;
  }
  uVar4 = google::protobuf::RepeatedField<long>::size(&(this->field_0)._impl_.packed_sfixed64_);
  if (uVar4 == 0) {
    local_a8 = 0;
  }
  else {
    uVar14 = ((long)((ulong)uVar4 << 0x23) >> 0x20) + 1;
    lVar17 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    local_a8 = (ulong)((int)lVar17 * 9 + 0x49U >> 6) + 2;
  }
  uVar5 = google::protobuf::RepeatedField<float>::size(&(this->field_0)._impl_.packed_float_);
  if (uVar5 == 0) {
    lVar17 = 0;
  }
  else {
    uVar14 = ((long)((ulong)uVar5 << 0x22) >> 0x20) + 1;
    lVar17 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar17 == 0; lVar17 = lVar17 + -1) {
      }
    }
    lVar17 = (ulong)((int)lVar17 * 9 + 0x49U >> 6) + 2;
  }
  uVar6 = google::protobuf::RepeatedField<double>::size(&(this->field_0)._impl_.packed_double_);
  if (uVar6 == 0) {
    lVar16 = 0;
  }
  else {
    uVar14 = ((long)((ulong)uVar6 << 0x23) >> 0x20) + 1;
    lVar16 = 0x3f;
    if (uVar14 != 0) {
      for (; uVar14 >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    lVar16 = (ulong)((int)lVar16 * 9 + 0x49U >> 6) + 2;
  }
  uVar7 = google::protobuf::RepeatedField<bool>::size(&(this->field_0)._impl_.packed_bool_);
  if (uVar7 == 0) {
    lVar18 = 0;
  }
  else {
    lVar18 = 0x3f;
    if ((long)(int)(uVar7 | 1) != 0) {
      for (; (ulong)(long)(int)(uVar7 | 1) >> lVar18 == 0; lVar18 = lVar18 + -1) {
      }
    }
    lVar18 = (ulong)((int)lVar18 * 9 + 0x49U >> 6) + 2;
  }
  sVar15 = google::protobuf::internal::WireFormatLite::EnumSizeWithPackedTagSize
                     (&(this->field_0)._impl_.packed_enum_,2,
                      &(this->field_0)._impl_._packed_enum_cached_byte_size_);
  sVar8 = lVar16 + (ulong)uVar7 + lVar18 + sVar15 +
          lVar19 + local_a0 + local_a8 +
          sVar12 + sVar13 + local_98 + sVar10 + sVar11 + sVar9 + sVar8 +
          ((ulong)uVar3 + (ulong)uVar1 + (ulong)uVar5) * 4 + lVar17 +
          ((ulong)uVar4 + (ulong)uVar2 + (ulong)uVar6) * 8;
  uVar14 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar14 & 1) != 0) {
    sVar8 = sVar8 + *(long *)((uVar14 & 0xfffffffffffffffe) + 0x10);
  }
  if (((int)sVar8 != 0) || ((this->field_0)._impl_._cached_size_.atom_ != 0)) {
    (this->field_0)._impl_._cached_size_.atom_ = (int)sVar8;
  }
  return sVar8;
}

Assistant:

::size_t TestPackedTypesLite::ByteSizeLong() const {
  const TestPackedTypesLite& this_ = *this;
#endif  // PROTOBUF_CUSTOM_VTABLE
  // @@protoc_insertion_point(message_byte_size_start:proto2_unittest.TestPackedTypesLite)
  ::size_t total_size = 0;

  ::uint32_t cached_has_bits = 0;
  // Prevent compiler warnings about cached_has_bits being unused
  (void)cached_has_bits;

  ::_pbi::Prefetch5LinesFrom7Lines(&this_);
   {
    // repeated int32 packed_int32 = 90 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int32SizeWithPackedTagSize(
              this_._internal_packed_int32(), 2,
              this_._impl_._packed_int32_cached_byte_size_);
    }
    // repeated int64 packed_int64 = 91 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::Int64SizeWithPackedTagSize(
              this_._internal_packed_int64(), 2,
              this_._impl_._packed_int64_cached_byte_size_);
    }
    // repeated uint32 packed_uint32 = 92 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt32SizeWithPackedTagSize(
              this_._internal_packed_uint32(), 2,
              this_._impl_._packed_uint32_cached_byte_size_);
    }
    // repeated uint64 packed_uint64 = 93 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::UInt64SizeWithPackedTagSize(
              this_._internal_packed_uint64(), 2,
              this_._impl_._packed_uint64_cached_byte_size_);
    }
    // repeated sint32 packed_sint32 = 94 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt32SizeWithPackedTagSize(
              this_._internal_packed_sint32(), 2,
              this_._impl_._packed_sint32_cached_byte_size_);
    }
    // repeated sint64 packed_sint64 = 95 [features = {
    {
      total_size +=
          ::_pbi::WireFormatLite::SInt64SizeWithPackedTagSize(
              this_._internal_packed_sint64(), 2,
              this_._impl_._packed_sint64_cached_byte_size_);
    }
    // repeated fixed32 packed_fixed32 = 96 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_packed_fixed32_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated fixed64 packed_fixed64 = 97 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_packed_fixed64_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated sfixed32 packed_sfixed32 = 98 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_packed_sfixed32_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated sfixed64 packed_sfixed64 = 99 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_packed_sfixed64_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated float packed_float = 100 [features = {
    {
      ::size_t data_size = ::size_t{4} *
          ::_pbi::FromIntSize(this_._internal_packed_float_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated double packed_double = 101 [features = {
    {
      ::size_t data_size = ::size_t{8} *
          ::_pbi::FromIntSize(this_._internal_packed_double_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated bool packed_bool = 102 [features = {
    {
      ::size_t data_size = ::size_t{1} *
          ::_pbi::FromIntSize(this_._internal_packed_bool_size());
      ::size_t tag_size = data_size == 0
          ? 0
          : 2 + ::_pbi::WireFormatLite::Int32Size(
                              static_cast<::int32_t>(data_size));
      total_size += tag_size + data_size;
    }
    // repeated .proto2_unittest.ForeignEnumLite packed_enum = 103 [features = {
    {
      total_size += ::_pbi::WireFormatLite::EnumSizeWithPackedTagSize(
          this_._internal_packed_enum(), 2, this_._impl_._packed_enum_cached_byte_size_);
    }
  }
  if (ABSL_PREDICT_FALSE(this_._internal_metadata_.have_unknown_fields())) {
    total_size += this_._internal_metadata_.unknown_fields<std::string>(::google::protobuf::internal::GetEmptyString).size();
  }
  this_._impl_._cached_size_.Set(::_pbi::ToCachedSize(total_size));
  return total_size;
}